

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O0

void start_input_gif(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  undefined8 uVar6;
  long in_RSI;
  long *in_RDI;
  int *_mp_1;
  cd_progress_ptr progress;
  int *_mp;
  int c;
  int aspectRatio;
  int colormaplen;
  uint height;
  uint width;
  U_CHAR hdrbuf [10];
  gif_source_ptr source;
  gif_source_ptr in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  gif_source_ptr in_stack_ffffffffffffffc0;
  int local_38;
  int local_30;
  byte local_22;
  byte local_21;
  byte local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  long local_18;
  long *local_8;
  
  local_18 = in_RSI;
  local_8 = in_RDI;
  sVar5 = fread(&local_22,1,6,*(FILE **)(in_RSI + 0x18));
  if (sVar5 != 6) {
    *(undefined4 *)(*local_8 + 0x28) = 0x3fb;
    (**(code **)*local_8)(local_8);
  }
  if (((local_22 != 0x47) || (local_21 != 0x49)) || (local_20 != 0x46)) {
    *(undefined4 *)(*local_8 + 0x28) = 0x3fb;
    (**(code **)*local_8)(local_8);
  }
  if ((((local_1f != 0x38) || (local_1e != 0x37)) || (local_1d != 0x61)) &&
     (((local_1f != 0x38 || (local_1e != 0x39)) || (local_1d != 0x61)))) {
    lVar1 = *local_8;
    in_stack_ffffffffffffffc0 = (gif_source_ptr)(lVar1 + 0x2c);
    *(uint *)&(in_stack_ffffffffffffffc0->pub).start_input = (uint)local_1f;
    *(uint *)(lVar1 + 0x30) = (uint)local_1e;
    *(uint *)(lVar1 + 0x34) = (uint)local_1d;
    *(undefined4 *)(*local_8 + 0x28) = 0x3fd;
    (**(code **)(*local_8 + 8))(local_8,1);
  }
  sVar5 = fread(&local_22,1,7,*(FILE **)(local_18 + 0x18));
  if (sVar5 != 7) {
    *(undefined4 *)(*local_8 + 0x28) = 0x2b;
    (**(code **)*local_8)(local_8);
  }
  if (((uint)local_22 + (uint)local_21 * 0x100 == 0) ||
     ((uint)local_20 + (uint)local_1f * 0x100 == 0)) {
    *(undefined4 *)(*local_8 + 0x28) = 0x3f9;
    (**(code **)*local_8)(local_8);
  }
  if ((local_1c != 0) && (local_1c != 0x31)) {
    *(undefined4 *)(*local_8 + 0x28) = 0x3ff;
    (**(code **)(*local_8 + 8))(local_8,1);
  }
  uVar6 = (**(code **)(local_8[1] + 0x10))(local_8,1,0x100,3);
  *(undefined8 *)(local_18 + 0x38) = uVar6;
  local_30 = 0;
  if ((local_1e & 0x80) != 0) {
    local_30 = 2 << (local_1e & 7);
    ReadColorMap(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                 (JSAMPARRAY)in_stack_ffffffffffffffb0);
  }
  while( true ) {
    while( true ) {
      iVar2 = ReadByte(in_stack_ffffffffffffffb0);
      if (iVar2 == 0x3b) {
        *(undefined4 *)(*local_8 + 0x28) = 0x3fa;
        (**(code **)*local_8)(local_8);
      }
      iVar4 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      if (iVar2 != 0x21) break;
      DoExtension(in_stack_ffffffffffffffb0);
    }
    if (iVar2 == 0x2c) break;
    *(undefined4 *)(*local_8 + 0x28) = 0x401;
    *(int *)(*local_8 + 0x2c) = iVar2;
    (**(code **)(*local_8 + 8))(local_8,0xffffffff);
  }
  sVar5 = fread(&local_22,1,9,*(FILE **)(local_18 + 0x18));
  if (sVar5 != 9) {
    *(undefined4 *)(*local_8 + 0x28) = 0x2b;
    (**(code **)*local_8)(local_8);
  }
  iVar2 = (uint)local_1e + (uint)local_1d * 0x100;
  iVar3 = (uint)local_1c + (uint)local_1b * 0x100;
  if ((iVar2 == 0) || (iVar3 == 0)) {
    *(undefined4 *)(*local_8 + 0x28) = 0x3f9;
    (**(code **)*local_8)(local_8);
  }
  *(uint *)(local_18 + 0x198) = (uint)((local_1a & 0x40) != 0);
  if ((local_1a & 0x80) != 0) {
    local_30 = 2 << (local_1a & 7);
    ReadColorMap(in_stack_ffffffffffffffc0,iVar4,(JSAMPARRAY)in_stack_ffffffffffffffb0);
  }
  iVar4 = ReadByte(in_stack_ffffffffffffffb0);
  *(int *)(local_18 + 0x158) = iVar4;
  if ((*(int *)(local_18 + 0x158) < 2) || (8 < *(int *)(local_18 + 0x158))) {
    *(undefined4 *)(*local_8 + 0x28) = 0x3f7;
    *(undefined4 *)(*local_8 + 0x2c) = *(undefined4 *)(local_18 + 0x158);
    (**(code **)*local_8)(local_8);
  }
  uVar6 = (**(code **)(local_8[1] + 8))(local_8,1,0x2000);
  *(undefined8 *)(local_18 + 0x178) = uVar6;
  uVar6 = (**(code **)(local_8[1] + 8))(local_8,1,0x1000);
  *(undefined8 *)(local_18 + 0x180) = uVar6;
  uVar6 = (**(code **)(local_8[1] + 8))(local_8,1,0x1000);
  *(undefined8 *)(local_18 + 0x188) = uVar6;
  InitLZWCode((gif_source_ptr)0x10400e);
  if (*(int *)(local_18 + 0x198) == 0) {
    *(code **)(local_18 + 8) = get_pixel_rows;
  }
  else {
    uVar6 = (**(code **)(local_8[1] + 0x20))(local_8,1,0,iVar2,iVar3);
    *(undefined8 *)(local_18 + 0x1a0) = uVar6;
    if (local_8[2] != 0) {
      *(int *)(local_8[2] + 0x24) = *(int *)(local_8[2] + 0x24) + 1;
    }
    *(code **)(local_18 + 8) = load_interlaced_image;
  }
  uVar6 = (**(code **)(local_8[1] + 0x10))(local_8,1,iVar2 * 3);
  *(undefined8 *)(local_18 + 0x20) = uVar6;
  *(undefined4 *)(local_18 + 0x28) = 1;
  for (local_38 = local_30; local_38 < *(int *)(local_18 + 0x15c); local_38 = local_38 + 1) {
    *(undefined1 *)(*(long *)(*(long *)(local_18 + 0x38) + 0x10) + (long)local_38) = 0x80;
    *(undefined1 *)(*(long *)(*(long *)(local_18 + 0x38) + 8) + (long)local_38) = 0x80;
    *(undefined1 *)(**(long **)(local_18 + 0x38) + (long)local_38) = 0x80;
  }
  *(undefined4 *)((long)local_8 + 0x3c) = 2;
  *(undefined4 *)(local_8 + 7) = 3;
  *(undefined4 *)(local_8 + 9) = 8;
  *(int *)(local_8 + 6) = iVar2;
  *(int *)((long)local_8 + 0x34) = iVar3;
  lVar1 = *local_8;
  *(int *)(lVar1 + 0x2c) = iVar2;
  *(int *)(lVar1 + 0x30) = iVar3;
  *(int *)(lVar1 + 0x34) = local_30;
  *(undefined4 *)(*local_8 + 0x28) = 0x3fc;
  (**(code **)(*local_8 + 8))(local_8,1);
  return;
}

Assistant:

METHODDEF(void)
start_input_gif(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  gif_source_ptr source = (gif_source_ptr)sinfo;
  U_CHAR hdrbuf[10];            /* workspace for reading control blocks */
  unsigned int width, height;   /* image dimensions */
  int colormaplen, aspectRatio;
  int c;

  /* Read and verify GIF Header */
  if (!ReadOK(source->pub.input_file, hdrbuf, 6))
    ERREXIT(cinfo, JERR_GIF_NOT);
  if (hdrbuf[0] != 'G' || hdrbuf[1] != 'I' || hdrbuf[2] != 'F')
    ERREXIT(cinfo, JERR_GIF_NOT);
  /* Check for expected version numbers.
   * If unknown version, give warning and try to process anyway;
   * this is per recommendation in GIF89a standard.
   */
  if ((hdrbuf[3] != '8' || hdrbuf[4] != '7' || hdrbuf[5] != 'a') &&
      (hdrbuf[3] != '8' || hdrbuf[4] != '9' || hdrbuf[5] != 'a'))
    TRACEMS3(cinfo, 1, JTRC_GIF_BADVERSION, hdrbuf[3], hdrbuf[4], hdrbuf[5]);

  /* Read and decipher Logical Screen Descriptor */
  if (!ReadOK(source->pub.input_file, hdrbuf, 7))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  width = LM_to_uint(hdrbuf, 0);
  height = LM_to_uint(hdrbuf, 2);
  if (width == 0 || height == 0)
    ERREXIT(cinfo, JERR_GIF_EMPTY);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (sinfo->max_pixels &&
      (unsigned long long)width * height > sinfo->max_pixels)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif
  /* we ignore the color resolution, sort flag, and background color index */
  aspectRatio = UCH(hdrbuf[6]);
  if (aspectRatio != 0 && aspectRatio != 49)
    TRACEMS(cinfo, 1, JTRC_GIF_NONSQUARE);

  /* Allocate space to store the colormap */
  source->colormap = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)MAXCOLORMAPSIZE,
     (JDIMENSION)NUMCOLORS);
  colormaplen = 0;              /* indicate initialization */

  /* Read global colormap if header indicates it is present */
  if (BitSet(hdrbuf[4], COLORMAPFLAG)) {
    colormaplen = 2 << (hdrbuf[4] & 0x07);
    ReadColorMap(source, colormaplen, source->colormap);
  }

  /* Scan until we reach start of desired image.
   * We don't currently support skipping images, but could add it easily.
   */
  for (;;) {
    c = ReadByte(source);

    if (c == ';')               /* GIF terminator?? */
      ERREXIT(cinfo, JERR_GIF_IMAGENOTFOUND);

    if (c == '!') {             /* Extension */
      DoExtension(source);
      continue;
    }

    if (c != ',') {             /* Not an image separator? */
      WARNMS1(cinfo, JWRN_GIF_CHAR, c);
      continue;
    }

    /* Read and decipher Local Image Descriptor */
    if (!ReadOK(source->pub.input_file, hdrbuf, 9))
      ERREXIT(cinfo, JERR_INPUT_EOF);
    /* we ignore top/left position info, also sort flag */
    width = LM_to_uint(hdrbuf, 4);
    height = LM_to_uint(hdrbuf, 6);
    if (width == 0 || height == 0)
      ERREXIT(cinfo, JERR_GIF_EMPTY);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (sinfo->max_pixels &&
        (unsigned long long)width * height > sinfo->max_pixels)
      ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif
    source->is_interlaced = (BitSet(hdrbuf[8], INTERLACE) != 0);

    /* Read local colormap if header indicates it is present */
    /* Note: if we wanted to support skipping images, */
    /* we'd need to skip rather than read colormap for ignored images */
    if (BitSet(hdrbuf[8], COLORMAPFLAG)) {
      colormaplen = 2 << (hdrbuf[8] & 0x07);
      ReadColorMap(source, colormaplen, source->colormap);
    }

    source->input_code_size = ReadByte(source); /* get min-code-size byte */
    if (source->input_code_size < 2 || source->input_code_size > 8)
      ERREXIT1(cinfo, JERR_GIF_CODESIZE, source->input_code_size);

    /* Reached desired image, so break out of loop */
    /* If we wanted to skip this image, */
    /* we'd call SkipDataBlocks and then continue the loop */
    break;
  }

  /* Prepare to read selected image: first initialize LZW decompressor */
  source->symbol_head = (UINT16 *)
    (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                LZW_TABLE_SIZE * sizeof(UINT16));
  source->symbol_tail = (UINT8 *)
    (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                LZW_TABLE_SIZE * sizeof(UINT8));
  source->symbol_stack = (UINT8 *)
    (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                LZW_TABLE_SIZE * sizeof(UINT8));
  InitLZWCode(source);

  /*
   * If image is interlaced, we read it into a full-size sample array,
   * decompressing as we go; then get_interlaced_row selects rows from the
   * sample array in the proper order.
   */
  if (source->is_interlaced) {
    /* We request the virtual array now, but can't access it until virtual
     * arrays have been allocated.  Hence, the actual work of reading the
     * image is postponed until the first call to get_pixel_rows.
     */
    source->interlaced_image = (*cinfo->mem->request_virt_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
       (JDIMENSION)width, (JDIMENSION)height, (JDIMENSION)1);
    if (cinfo->progress != NULL) {
      cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;
      progress->total_extra_passes++; /* count file input as separate pass */
    }
    source->pub.get_pixel_rows = load_interlaced_image;
  } else {
    source->pub.get_pixel_rows = get_pixel_rows;
  }

  /* Create compressor input buffer. */
  source->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)width * NUMCOLORS,
     (JDIMENSION)1);
  source->pub.buffer_height = 1;

  /* Pad colormap for safety. */
  for (c = colormaplen; c < source->clear_code; c++) {
    source->colormap[CM_RED][c]   =
    source->colormap[CM_GREEN][c] =
    source->colormap[CM_BLUE][c]  = CENTERJSAMPLE;
  }

  /* Return info about the image. */
  cinfo->in_color_space = JCS_RGB;
  cinfo->input_components = NUMCOLORS;
  cinfo->data_precision = BITS_IN_JSAMPLE; /* we always rescale data to this */
  cinfo->image_width = width;
  cinfo->image_height = height;

  TRACEMS3(cinfo, 1, JTRC_GIF, width, height, colormaplen);
}